

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O1

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::cleanup
          (Fasttrack<std::shared_mutex> *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [11];
  undefined1 auVar17 [11];
  undefined1 auVar18 [11];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  uint uVar31;
  key_arg<unsigned_int> kVar32;
  slot_type *psVar33;
  slot_type *psVar34;
  char *pcVar35;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator it;
  key_arg<unsigned_int> local_5c;
  iterator local_58;
  
  pcVar35 = (this->locks).
            super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
            .
            super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
            .ctrl_;
  psVar33 = (this->locks).
            super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
            .
            super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
            .slots_;
  cVar1 = *pcVar35;
  while (cVar1 < -1) {
    iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar35 < (char)iVar11);
    in_XMM1_Bb = -(pcVar35[1] < (char)((uint)iVar11 >> 8));
    in_XMM1_Bc = -(pcVar35[2] < (char)((uint)iVar11 >> 0x10));
    in_XMM1_Bd = -(pcVar35[3] < (char)((uint)iVar11 >> 0x18));
    in_XMM1_Be = -(pcVar35[4] < (char)iVar12);
    in_XMM1_Bf = -(pcVar35[5] < (char)((uint)iVar12 >> 8));
    in_XMM1_Bg = -(pcVar35[6] < (char)((uint)iVar12 >> 0x10));
    in_XMM1_Bh = -(pcVar35[7] < (char)((uint)iVar12 >> 0x18));
    in_XMM1_Bi = -(pcVar35[8] < (char)iVar13);
    in_XMM1_Bj = -(pcVar35[9] < (char)((uint)iVar13 >> 8));
    in_XMM1_Bk = -(pcVar35[10] < (char)((uint)iVar13 >> 0x10));
    in_XMM1_Bl = -(pcVar35[0xb] < (char)((uint)iVar13 >> 0x18));
    in_XMM1_Bm = -(pcVar35[0xc] < (char)iVar14);
    in_XMM1_Bn = -(pcVar35[0xd] < (char)((uint)iVar14 >> 8));
    in_XMM1_Bo = -(pcVar35[0xe] < (char)((uint)iVar14 >> 0x10));
    in_XMM1_Bp = -(pcVar35[0xf] < (char)((uint)iVar14 >> 0x18));
    auVar3[1] = in_XMM1_Bb;
    auVar3[0] = in_XMM1_Ba;
    auVar3[2] = in_XMM1_Bc;
    auVar3[3] = in_XMM1_Bd;
    auVar3[4] = in_XMM1_Be;
    auVar3[5] = in_XMM1_Bf;
    auVar3[6] = in_XMM1_Bg;
    auVar3[7] = in_XMM1_Bh;
    auVar3[8] = in_XMM1_Bi;
    auVar3[9] = in_XMM1_Bj;
    auVar3[10] = in_XMM1_Bk;
    auVar3[0xb] = in_XMM1_Bl;
    auVar3[0xc] = in_XMM1_Bm;
    auVar3[0xd] = in_XMM1_Bn;
    auVar3[0xe] = in_XMM1_Bo;
    auVar3[0xf] = in_XMM1_Bp;
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar27[1] = in_XMM1_Bd;
    auVar27[0] = in_XMM1_Bc;
    auVar27[2] = in_XMM1_Be;
    auVar27[3] = in_XMM1_Bf;
    auVar27[4] = in_XMM1_Bg;
    auVar27[5] = in_XMM1_Bh;
    auVar27[6] = in_XMM1_Bi;
    auVar27[7] = in_XMM1_Bj;
    auVar27[8] = in_XMM1_Bk;
    auVar27[9] = in_XMM1_Bl;
    auVar27[10] = in_XMM1_Bm;
    auVar27[0xb] = in_XMM1_Bn;
    auVar27[0xc] = in_XMM1_Bo;
    auVar27[0xd] = in_XMM1_Bp;
    auVar23[1] = in_XMM1_Be;
    auVar23[0] = in_XMM1_Bd;
    auVar23[2] = in_XMM1_Bf;
    auVar23[3] = in_XMM1_Bg;
    auVar23[4] = in_XMM1_Bh;
    auVar23[5] = in_XMM1_Bi;
    auVar23[6] = in_XMM1_Bj;
    auVar23[7] = in_XMM1_Bk;
    auVar23[8] = in_XMM1_Bl;
    auVar23[9] = in_XMM1_Bm;
    auVar23[10] = in_XMM1_Bn;
    auVar23[0xb] = in_XMM1_Bo;
    auVar23[0xc] = in_XMM1_Bp;
    auVar19[1] = in_XMM1_Bf;
    auVar19[0] = in_XMM1_Be;
    auVar19[2] = in_XMM1_Bg;
    auVar19[3] = in_XMM1_Bh;
    auVar19[4] = in_XMM1_Bi;
    auVar19[5] = in_XMM1_Bj;
    auVar19[6] = in_XMM1_Bk;
    auVar19[7] = in_XMM1_Bl;
    auVar19[8] = in_XMM1_Bm;
    auVar19[9] = in_XMM1_Bn;
    auVar19[10] = in_XMM1_Bo;
    auVar19[0xb] = in_XMM1_Bp;
    auVar15[1] = in_XMM1_Bg;
    auVar15[0] = in_XMM1_Bf;
    auVar15[2] = in_XMM1_Bh;
    auVar15[3] = in_XMM1_Bi;
    auVar15[4] = in_XMM1_Bj;
    auVar15[5] = in_XMM1_Bk;
    auVar15[6] = in_XMM1_Bl;
    auVar15[7] = in_XMM1_Bm;
    auVar15[8] = in_XMM1_Bn;
    auVar15[9] = in_XMM1_Bo;
    auVar15[10] = in_XMM1_Bp;
    uVar31 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar27 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar23 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar19 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar2 = 0;
    if (uVar31 != 0) {
      for (; (uVar31 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    psVar33 = psVar33 + uVar2;
    cVar1 = pcVar35[uVar2];
    pcVar35 = pcVar35 + uVar2;
  }
  kVar32 = (key_arg<unsigned_int>)ctx;
  if (pcVar35 !=
      (this->locks).
      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
      .
      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
      .ctrl_ + (this->locks).
               super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
               .
               super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
               .capacity_) {
    do {
      local_58.inner_._0_4_ = kVar32;
      phmap::container_internal::
      raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::erase<unsigned_int>
                ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                  *)&(psVar33->value).second,(key_arg<unsigned_int> *)&local_58);
      psVar33 = psVar33 + 1;
      cVar1 = pcVar35[1];
      pcVar35 = pcVar35 + 1;
      while (cVar1 < -1) {
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar35 < (char)iVar11);
        in_XMM1_Bb = -(pcVar35[1] < (char)((uint)iVar11 >> 8));
        in_XMM1_Bc = -(pcVar35[2] < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bd = -(pcVar35[3] < (char)((uint)iVar11 >> 0x18));
        in_XMM1_Be = -(pcVar35[4] < (char)iVar12);
        in_XMM1_Bf = -(pcVar35[5] < (char)((uint)iVar12 >> 8));
        in_XMM1_Bg = -(pcVar35[6] < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bh = -(pcVar35[7] < (char)((uint)iVar12 >> 0x18));
        in_XMM1_Bi = -(pcVar35[8] < (char)iVar13);
        in_XMM1_Bj = -(pcVar35[9] < (char)((uint)iVar13 >> 8));
        in_XMM1_Bk = -(pcVar35[10] < (char)((uint)iVar13 >> 0x10));
        in_XMM1_Bl = -(pcVar35[0xb] < (char)((uint)iVar13 >> 0x18));
        in_XMM1_Bm = -(pcVar35[0xc] < (char)iVar14);
        in_XMM1_Bn = -(pcVar35[0xd] < (char)((uint)iVar14 >> 8));
        in_XMM1_Bo = -(pcVar35[0xe] < (char)((uint)iVar14 >> 0x10));
        in_XMM1_Bp = -(pcVar35[0xf] < (char)((uint)iVar14 >> 0x18));
        auVar5[1] = in_XMM1_Bb;
        auVar5[0] = in_XMM1_Ba;
        auVar5[2] = in_XMM1_Bc;
        auVar5[3] = in_XMM1_Bd;
        auVar5[4] = in_XMM1_Be;
        auVar5[5] = in_XMM1_Bf;
        auVar5[6] = in_XMM1_Bg;
        auVar5[7] = in_XMM1_Bh;
        auVar5[8] = in_XMM1_Bi;
        auVar5[9] = in_XMM1_Bj;
        auVar5[10] = in_XMM1_Bk;
        auVar5[0xb] = in_XMM1_Bl;
        auVar5[0xc] = in_XMM1_Bm;
        auVar5[0xd] = in_XMM1_Bn;
        auVar5[0xe] = in_XMM1_Bo;
        auVar5[0xf] = in_XMM1_Bp;
        auVar6[1] = in_XMM1_Bb;
        auVar6[0] = in_XMM1_Ba;
        auVar6[2] = in_XMM1_Bc;
        auVar6[3] = in_XMM1_Bd;
        auVar6[4] = in_XMM1_Be;
        auVar6[5] = in_XMM1_Bf;
        auVar6[6] = in_XMM1_Bg;
        auVar6[7] = in_XMM1_Bh;
        auVar6[8] = in_XMM1_Bi;
        auVar6[9] = in_XMM1_Bj;
        auVar6[10] = in_XMM1_Bk;
        auVar6[0xb] = in_XMM1_Bl;
        auVar6[0xc] = in_XMM1_Bm;
        auVar6[0xd] = in_XMM1_Bn;
        auVar6[0xe] = in_XMM1_Bo;
        auVar6[0xf] = in_XMM1_Bp;
        auVar28[1] = in_XMM1_Bd;
        auVar28[0] = in_XMM1_Bc;
        auVar28[2] = in_XMM1_Be;
        auVar28[3] = in_XMM1_Bf;
        auVar28[4] = in_XMM1_Bg;
        auVar28[5] = in_XMM1_Bh;
        auVar28[6] = in_XMM1_Bi;
        auVar28[7] = in_XMM1_Bj;
        auVar28[8] = in_XMM1_Bk;
        auVar28[9] = in_XMM1_Bl;
        auVar28[10] = in_XMM1_Bm;
        auVar28[0xb] = in_XMM1_Bn;
        auVar28[0xc] = in_XMM1_Bo;
        auVar28[0xd] = in_XMM1_Bp;
        auVar24[1] = in_XMM1_Be;
        auVar24[0] = in_XMM1_Bd;
        auVar24[2] = in_XMM1_Bf;
        auVar24[3] = in_XMM1_Bg;
        auVar24[4] = in_XMM1_Bh;
        auVar24[5] = in_XMM1_Bi;
        auVar24[6] = in_XMM1_Bj;
        auVar24[7] = in_XMM1_Bk;
        auVar24[8] = in_XMM1_Bl;
        auVar24[9] = in_XMM1_Bm;
        auVar24[10] = in_XMM1_Bn;
        auVar24[0xb] = in_XMM1_Bo;
        auVar24[0xc] = in_XMM1_Bp;
        auVar20[1] = in_XMM1_Bf;
        auVar20[0] = in_XMM1_Be;
        auVar20[2] = in_XMM1_Bg;
        auVar20[3] = in_XMM1_Bh;
        auVar20[4] = in_XMM1_Bi;
        auVar20[5] = in_XMM1_Bj;
        auVar20[6] = in_XMM1_Bk;
        auVar20[7] = in_XMM1_Bl;
        auVar20[8] = in_XMM1_Bm;
        auVar20[9] = in_XMM1_Bn;
        auVar20[10] = in_XMM1_Bo;
        auVar20[0xb] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Bg;
        auVar16[0] = in_XMM1_Bf;
        auVar16[2] = in_XMM1_Bh;
        auVar16[3] = in_XMM1_Bi;
        auVar16[4] = in_XMM1_Bj;
        auVar16[5] = in_XMM1_Bk;
        auVar16[6] = in_XMM1_Bl;
        auVar16[7] = in_XMM1_Bm;
        auVar16[8] = in_XMM1_Bn;
        auVar16[9] = in_XMM1_Bo;
        auVar16[10] = in_XMM1_Bp;
        uVar31 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar28 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar24 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar20 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar16 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar2 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        psVar33 = psVar33 + uVar2;
        cVar1 = pcVar35[uVar2];
        pcVar35 = pcVar35 + uVar2;
      }
    } while (pcVar35 !=
             (this->locks).
             super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             .
             super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
             .ctrl_ + (this->locks).
                      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                      .
                      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                      .capacity_);
  }
  pcVar35 = (this->threads).
            super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
            .
            super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
            .ctrl_;
  psVar34 = (this->threads).
            super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
            .
            super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
            .slots_;
  cVar1 = *pcVar35;
  while (cVar1 < -1) {
    iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar35 < (char)iVar11);
    in_XMM1_Bb = -(pcVar35[1] < (char)((uint)iVar11 >> 8));
    in_XMM1_Bc = -(pcVar35[2] < (char)((uint)iVar11 >> 0x10));
    in_XMM1_Bd = -(pcVar35[3] < (char)((uint)iVar11 >> 0x18));
    in_XMM1_Be = -(pcVar35[4] < (char)iVar12);
    in_XMM1_Bf = -(pcVar35[5] < (char)((uint)iVar12 >> 8));
    in_XMM1_Bg = -(pcVar35[6] < (char)((uint)iVar12 >> 0x10));
    in_XMM1_Bh = -(pcVar35[7] < (char)((uint)iVar12 >> 0x18));
    in_XMM1_Bi = -(pcVar35[8] < (char)iVar13);
    in_XMM1_Bj = -(pcVar35[9] < (char)((uint)iVar13 >> 8));
    in_XMM1_Bk = -(pcVar35[10] < (char)((uint)iVar13 >> 0x10));
    in_XMM1_Bl = -(pcVar35[0xb] < (char)((uint)iVar13 >> 0x18));
    in_XMM1_Bm = -(pcVar35[0xc] < (char)iVar14);
    in_XMM1_Bn = -(pcVar35[0xd] < (char)((uint)iVar14 >> 8));
    in_XMM1_Bo = -(pcVar35[0xe] < (char)((uint)iVar14 >> 0x10));
    in_XMM1_Bp = -(pcVar35[0xf] < (char)((uint)iVar14 >> 0x18));
    auVar7[1] = in_XMM1_Bb;
    auVar7[0] = in_XMM1_Ba;
    auVar7[2] = in_XMM1_Bc;
    auVar7[3] = in_XMM1_Bd;
    auVar7[4] = in_XMM1_Be;
    auVar7[5] = in_XMM1_Bf;
    auVar7[6] = in_XMM1_Bg;
    auVar7[7] = in_XMM1_Bh;
    auVar7[8] = in_XMM1_Bi;
    auVar7[9] = in_XMM1_Bj;
    auVar7[10] = in_XMM1_Bk;
    auVar7[0xb] = in_XMM1_Bl;
    auVar7[0xc] = in_XMM1_Bm;
    auVar7[0xd] = in_XMM1_Bn;
    auVar7[0xe] = in_XMM1_Bo;
    auVar7[0xf] = in_XMM1_Bp;
    auVar8[1] = in_XMM1_Bb;
    auVar8[0] = in_XMM1_Ba;
    auVar8[2] = in_XMM1_Bc;
    auVar8[3] = in_XMM1_Bd;
    auVar8[4] = in_XMM1_Be;
    auVar8[5] = in_XMM1_Bf;
    auVar8[6] = in_XMM1_Bg;
    auVar8[7] = in_XMM1_Bh;
    auVar8[8] = in_XMM1_Bi;
    auVar8[9] = in_XMM1_Bj;
    auVar8[10] = in_XMM1_Bk;
    auVar8[0xb] = in_XMM1_Bl;
    auVar8[0xc] = in_XMM1_Bm;
    auVar8[0xd] = in_XMM1_Bn;
    auVar8[0xe] = in_XMM1_Bo;
    auVar8[0xf] = in_XMM1_Bp;
    auVar29[1] = in_XMM1_Bd;
    auVar29[0] = in_XMM1_Bc;
    auVar29[2] = in_XMM1_Be;
    auVar29[3] = in_XMM1_Bf;
    auVar29[4] = in_XMM1_Bg;
    auVar29[5] = in_XMM1_Bh;
    auVar29[6] = in_XMM1_Bi;
    auVar29[7] = in_XMM1_Bj;
    auVar29[8] = in_XMM1_Bk;
    auVar29[9] = in_XMM1_Bl;
    auVar29[10] = in_XMM1_Bm;
    auVar29[0xb] = in_XMM1_Bn;
    auVar29[0xc] = in_XMM1_Bo;
    auVar29[0xd] = in_XMM1_Bp;
    auVar25[1] = in_XMM1_Be;
    auVar25[0] = in_XMM1_Bd;
    auVar25[2] = in_XMM1_Bf;
    auVar25[3] = in_XMM1_Bg;
    auVar25[4] = in_XMM1_Bh;
    auVar25[5] = in_XMM1_Bi;
    auVar25[6] = in_XMM1_Bj;
    auVar25[7] = in_XMM1_Bk;
    auVar25[8] = in_XMM1_Bl;
    auVar25[9] = in_XMM1_Bm;
    auVar25[10] = in_XMM1_Bn;
    auVar25[0xb] = in_XMM1_Bo;
    auVar25[0xc] = in_XMM1_Bp;
    auVar21[1] = in_XMM1_Bf;
    auVar21[0] = in_XMM1_Be;
    auVar21[2] = in_XMM1_Bg;
    auVar21[3] = in_XMM1_Bh;
    auVar21[4] = in_XMM1_Bi;
    auVar21[5] = in_XMM1_Bj;
    auVar21[6] = in_XMM1_Bk;
    auVar21[7] = in_XMM1_Bl;
    auVar21[8] = in_XMM1_Bm;
    auVar21[9] = in_XMM1_Bn;
    auVar21[10] = in_XMM1_Bo;
    auVar21[0xb] = in_XMM1_Bp;
    auVar17[1] = in_XMM1_Bg;
    auVar17[0] = in_XMM1_Bf;
    auVar17[2] = in_XMM1_Bh;
    auVar17[3] = in_XMM1_Bi;
    auVar17[4] = in_XMM1_Bj;
    auVar17[5] = in_XMM1_Bk;
    auVar17[6] = in_XMM1_Bl;
    auVar17[7] = in_XMM1_Bm;
    auVar17[8] = in_XMM1_Bn;
    auVar17[9] = in_XMM1_Bo;
    auVar17[10] = in_XMM1_Bp;
    uVar31 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar29 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar25 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar21 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar17 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar2 = 0;
    if (uVar31 != 0) {
      for (; (uVar31 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    psVar34 = psVar34 + uVar2;
    cVar1 = pcVar35[uVar2];
    pcVar35 = pcVar35 + uVar2;
  }
  if (pcVar35 !=
      (this->threads).
      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
      .
      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
      .ctrl_ + (this->threads).
               super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
               .
               super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
               .capacity_) {
    do {
      local_58.inner_._0_4_ = kVar32;
      phmap::container_internal::
      raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::erase<unsigned_int>
                ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                  *)(psVar34->value).second.
                    super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (key_arg<unsigned_int> *)&local_58);
      psVar34 = psVar34 + 1;
      cVar1 = pcVar35[1];
      pcVar35 = pcVar35 + 1;
      while (cVar1 < -1) {
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar35 < (char)iVar11);
        in_XMM1_Bb = -(pcVar35[1] < (char)((uint)iVar11 >> 8));
        in_XMM1_Bc = -(pcVar35[2] < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bd = -(pcVar35[3] < (char)((uint)iVar11 >> 0x18));
        in_XMM1_Be = -(pcVar35[4] < (char)iVar12);
        in_XMM1_Bf = -(pcVar35[5] < (char)((uint)iVar12 >> 8));
        in_XMM1_Bg = -(pcVar35[6] < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bh = -(pcVar35[7] < (char)((uint)iVar12 >> 0x18));
        in_XMM1_Bi = -(pcVar35[8] < (char)iVar13);
        in_XMM1_Bj = -(pcVar35[9] < (char)((uint)iVar13 >> 8));
        in_XMM1_Bk = -(pcVar35[10] < (char)((uint)iVar13 >> 0x10));
        in_XMM1_Bl = -(pcVar35[0xb] < (char)((uint)iVar13 >> 0x18));
        in_XMM1_Bm = -(pcVar35[0xc] < (char)iVar14);
        in_XMM1_Bn = -(pcVar35[0xd] < (char)((uint)iVar14 >> 8));
        in_XMM1_Bo = -(pcVar35[0xe] < (char)((uint)iVar14 >> 0x10));
        in_XMM1_Bp = -(pcVar35[0xf] < (char)((uint)iVar14 >> 0x18));
        auVar9[1] = in_XMM1_Bb;
        auVar9[0] = in_XMM1_Ba;
        auVar9[2] = in_XMM1_Bc;
        auVar9[3] = in_XMM1_Bd;
        auVar9[4] = in_XMM1_Be;
        auVar9[5] = in_XMM1_Bf;
        auVar9[6] = in_XMM1_Bg;
        auVar9[7] = in_XMM1_Bh;
        auVar9[8] = in_XMM1_Bi;
        auVar9[9] = in_XMM1_Bj;
        auVar9[10] = in_XMM1_Bk;
        auVar9[0xb] = in_XMM1_Bl;
        auVar9[0xc] = in_XMM1_Bm;
        auVar9[0xd] = in_XMM1_Bn;
        auVar9[0xe] = in_XMM1_Bo;
        auVar9[0xf] = in_XMM1_Bp;
        auVar10[1] = in_XMM1_Bb;
        auVar10[0] = in_XMM1_Ba;
        auVar10[2] = in_XMM1_Bc;
        auVar10[3] = in_XMM1_Bd;
        auVar10[4] = in_XMM1_Be;
        auVar10[5] = in_XMM1_Bf;
        auVar10[6] = in_XMM1_Bg;
        auVar10[7] = in_XMM1_Bh;
        auVar10[8] = in_XMM1_Bi;
        auVar10[9] = in_XMM1_Bj;
        auVar10[10] = in_XMM1_Bk;
        auVar10[0xb] = in_XMM1_Bl;
        auVar10[0xc] = in_XMM1_Bm;
        auVar10[0xd] = in_XMM1_Bn;
        auVar10[0xe] = in_XMM1_Bo;
        auVar10[0xf] = in_XMM1_Bp;
        auVar30[1] = in_XMM1_Bd;
        auVar30[0] = in_XMM1_Bc;
        auVar30[2] = in_XMM1_Be;
        auVar30[3] = in_XMM1_Bf;
        auVar30[4] = in_XMM1_Bg;
        auVar30[5] = in_XMM1_Bh;
        auVar30[6] = in_XMM1_Bi;
        auVar30[7] = in_XMM1_Bj;
        auVar30[8] = in_XMM1_Bk;
        auVar30[9] = in_XMM1_Bl;
        auVar30[10] = in_XMM1_Bm;
        auVar30[0xb] = in_XMM1_Bn;
        auVar30[0xc] = in_XMM1_Bo;
        auVar30[0xd] = in_XMM1_Bp;
        auVar26[1] = in_XMM1_Be;
        auVar26[0] = in_XMM1_Bd;
        auVar26[2] = in_XMM1_Bf;
        auVar26[3] = in_XMM1_Bg;
        auVar26[4] = in_XMM1_Bh;
        auVar26[5] = in_XMM1_Bi;
        auVar26[6] = in_XMM1_Bj;
        auVar26[7] = in_XMM1_Bk;
        auVar26[8] = in_XMM1_Bl;
        auVar26[9] = in_XMM1_Bm;
        auVar26[10] = in_XMM1_Bn;
        auVar26[0xb] = in_XMM1_Bo;
        auVar26[0xc] = in_XMM1_Bp;
        auVar22[1] = in_XMM1_Bf;
        auVar22[0] = in_XMM1_Be;
        auVar22[2] = in_XMM1_Bg;
        auVar22[3] = in_XMM1_Bh;
        auVar22[4] = in_XMM1_Bi;
        auVar22[5] = in_XMM1_Bj;
        auVar22[6] = in_XMM1_Bk;
        auVar22[7] = in_XMM1_Bl;
        auVar22[8] = in_XMM1_Bm;
        auVar22[9] = in_XMM1_Bn;
        auVar22[10] = in_XMM1_Bo;
        auVar22[0xb] = in_XMM1_Bp;
        auVar18[1] = in_XMM1_Bg;
        auVar18[0] = in_XMM1_Bf;
        auVar18[2] = in_XMM1_Bh;
        auVar18[3] = in_XMM1_Bi;
        auVar18[4] = in_XMM1_Bj;
        auVar18[5] = in_XMM1_Bk;
        auVar18[6] = in_XMM1_Bl;
        auVar18[7] = in_XMM1_Bm;
        auVar18[8] = in_XMM1_Bn;
        auVar18[9] = in_XMM1_Bo;
        auVar18[10] = in_XMM1_Bp;
        uVar31 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar30 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar26 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar22 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar18 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar2 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        psVar34 = psVar34 + uVar2;
        cVar1 = pcVar35[uVar2];
        pcVar35 = pcVar35 + uVar2;
      }
    } while (pcVar35 !=
             (this->threads).
             super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
             .
             super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
             .ctrl_ + (this->threads).
                      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      .
                      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      .capacity_);
  }
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  ::begin(&local_58,
          (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           *)&this->happens_states);
  if (CONCAT44(local_58.inner_._4_4_,(key_arg<unsigned_int>)local_58.inner_) != 0) {
    do {
      local_5c = kVar32;
      phmap::container_internal::
      raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::erase<unsigned_int>
                ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                  *)((long)local_58.it_.field_1.slot_ + 8),&local_5c);
      phmap::container_internal::
      parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
      ::iterator::operator++(&local_58);
    } while (CONCAT44(local_58.inner_._4_4_,(key_arg<unsigned_int>)local_58.inner_) != 0);
  }
  return;
}

Assistant:

void cleanup(uint32_t tid) {
    {
      for (auto it = locks.begin(); it != locks.end(); ++it) {
        it->second.delete_vc(tid);
      }

      for (auto it = threads.begin(); it != threads.end(); ++it) {
        it->second->delete_vc(tid);
      }

      for (auto it = happens_states.begin(); it != happens_states.end(); ++it) {
        it->second.delete_vc(tid);
      }
    }
  }